

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O1

void __thiscall UDMFParser::ParseSidedef(UDMFParser *this,side_t *sd,intmapsidedef_t *sdt,int index)

{
  double dVar1;
  uint uVar2;
  undefined4 uVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  intmapsidedef_t *this_00;
  ulong uVar8;
  FName key;
  double local_60;
  double local_58;
  FName local_48;
  undefined1 local_44 [20];
  
  memset(sd,0,0xc0);
  local_44._12_8_ = &sdt->bottomtexture;
  FString::operator=((FString *)local_44._12_8_,"-");
  FString::operator=(&sdt->toptexture,"-");
  local_44._4_8_ = &sdt->midtexture;
  FString::operator=((FString *)local_44._4_8_,"-");
  sd->textures[2].xScale = 1.0;
  sd->textures[1].xScale = 1.0;
  sd->textures[0].xScale = 1.0;
  sd->textures[2].yScale = 1.0;
  sd->textures[1].yScale = 1.0;
  sd->textures[0].yScale = 1.0;
  sd->Index = index;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  bVar4 = FScanner::CheckToken((FScanner *)this,0x7d);
  local_60 = 0.0;
  local_58 = 0.0;
  if (!bVar4) {
    local_58 = 0.0;
    local_60 = 0.0;
    do {
      UDMFParserBase::ParseKey((UDMFParserBase *)local_44,SUB81(this,0),(bool *)0x0);
      uVar3 = local_44._0_4_;
      lVar6 = (long)(int)local_44._0_4_;
      switch(local_44._0_4_) {
      case 0x125:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Integer value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar6].Text);
        }
        local_60 = (double)(this->super_UDMFParserBase).sc.Number;
        break;
      case 0x126:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Integer value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar6].Text);
        }
        local_58 = (double)(this->super_UDMFParserBase).sc.Number;
        break;
      case 0x127:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar6].Text);
        }
        pcVar7 = (this->super_UDMFParserBase).parsedString.Chars;
        this_00 = sdt;
        goto LAB_00462a91;
      case 0x128:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar6].Text);
        }
        pcVar7 = (this->super_UDMFParserBase).parsedString.Chars;
        this_00 = (intmapsidedef_t *)local_44._12_8_;
        goto LAB_00462a91;
      case 0x129:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar6].Text);
        }
        pcVar7 = (this->super_UDMFParserBase).parsedString.Chars;
        this_00 = (intmapsidedef_t *)local_44._4_8_;
LAB_00462a91:
        FString::operator=(&this_00->toptexture,pcVar7);
        break;
      case 0x12a:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Integer value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar6].Text);
        }
        sd->sector = (sector_t_conflict *)(long)(this->super_UDMFParserBase).sc.Number;
        break;
      default:
        uVar2 = (this->super_UDMFParserBase).namespace_bits;
        if ((uVar2 & 0x70) == 0) {
switchD_00462b5e_default:
          if (((uVar2 & 0x30) != 0) &&
             (iVar5 = strncasecmp("user_",FName::NameData.NameArray[lVar6].Text,5), iVar5 == 0)) {
            local_48.Index = uVar3;
            AddUserKey(this,&local_48,1,index);
          }
          break;
        }
        if ((int)local_44._0_4_ < 0x1b7) {
          if (local_44._0_4_ == 0x130) {
            pcVar7 = FName::NameData.NameArray[lVar6].Text;
            iVar5 = 2;
          }
          else if (local_44._0_4_ == 0x177) {
            pcVar7 = FName::NameData.NameArray[lVar6].Text;
            iVar5 = 0x10;
          }
          else {
            if (local_44._0_4_ != 0x178) goto switchD_00462b5e_default;
            pcVar7 = FName::NameData.NameArray[lVar6].Text;
            iVar5 = 0x20;
          }
          goto LAB_00462fd8;
        }
        switch(local_44._0_4_) {
        case 0x1b7:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          sd->textures[0].xOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x1b8:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          sd->textures[0].yOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x1b9:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          sd->textures[1].xOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x1ba:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          sd->textures[1].yOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x1bb:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          sd->textures[2].xOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x1bc:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          sd->textures[2].yOffset = (this->super_UDMFParserBase).sc.Float;
          break;
        case 0x1bd:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          dVar1 = (this->super_UDMFParserBase).sc.Float;
          uVar8 = -(ulong)(dVar1 == 0.0);
          sd->textures[0].xScale = (double)(~uVar8 & (ulong)dVar1 | uVar8 & 0x3ff0000000000000);
          break;
        case 0x1be:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          dVar1 = (this->super_UDMFParserBase).sc.Float;
          uVar8 = -(ulong)(dVar1 == 0.0);
          sd->textures[0].yScale = (double)(~uVar8 & (ulong)dVar1 | uVar8 & 0x3ff0000000000000);
          break;
        case 0x1bf:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          dVar1 = (this->super_UDMFParserBase).sc.Float;
          uVar8 = -(ulong)(dVar1 == 0.0);
          sd->textures[1].xScale = (double)(~uVar8 & (ulong)dVar1 | uVar8 & 0x3ff0000000000000);
          break;
        case 0x1c0:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          dVar1 = (this->super_UDMFParserBase).sc.Float;
          uVar8 = -(ulong)(dVar1 == 0.0);
          sd->textures[1].yScale = (double)(~uVar8 & (ulong)dVar1 | uVar8 & 0x3ff0000000000000);
          break;
        case 0x1c1:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          dVar1 = (this->super_UDMFParserBase).sc.Float;
          uVar8 = -(ulong)(dVar1 == 0.0);
          sd->textures[2].xScale = (double)(~uVar8 & (ulong)dVar1 | uVar8 & 0x3ff0000000000000);
          break;
        case 0x1c2:
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          dVar1 = (this->super_UDMFParserBase).sc.Float;
          uVar8 = -(ulong)(dVar1 == 0.0);
          sd->textures[2].yScale = (double)(~uVar8 & (ulong)dVar1 | uVar8 & 0x3ff0000000000000);
          break;
        case 0x1c3:
          if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Integer value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar6].Text);
          }
          sd->Light = (SWORD)(this->super_UDMFParserBase).sc.Number;
          break;
        case 0x1c4:
          pcVar7 = FName::NameData.NameArray[lVar6].Text;
          iVar5 = 1;
          goto LAB_00462fd8;
        case 0x1c5:
          pcVar7 = FName::NameData.NameArray[lVar6].Text;
          iVar5 = 0x80;
          goto LAB_00462fd8;
        case 0x1c6:
          pcVar7 = FName::NameData.NameArray[lVar6].Text;
          iVar5 = 4;
          goto LAB_00462fd8;
        case 0x1c7:
          pcVar7 = FName::NameData.NameArray[lVar6].Text;
          iVar5 = 8;
LAB_00462fd8:
          UDMFParserBase::Flag<unsigned_char>(&this->super_UDMFParserBase,&sd->Flags,iVar5,pcVar7);
          break;
        default:
          goto switchD_00462b5e_default;
        }
      }
      bVar4 = FScanner::CheckToken((FScanner *)this,0x7d);
    } while (!bVar4);
  }
  sd->textures[0].xOffset = sd->textures[0].xOffset + local_60;
  sd->textures[1].xOffset = sd->textures[1].xOffset + local_60;
  sd->textures[2].xOffset = local_60 + sd->textures[2].xOffset;
  sd->textures[0].yOffset = sd->textures[0].yOffset + local_58;
  sd->textures[1].yOffset = sd->textures[1].yOffset + local_58;
  sd->textures[2].yOffset = local_58 + sd->textures[2].yOffset;
  return;
}

Assistant:

void ParseSidedef(side_t *sd, intmapsidedef_t *sdt, int index)
	{
		double texOfs[2]={0,0};

		memset(sd, 0, sizeof(*sd));
		sdt->bottomtexture = "-";
		sdt->toptexture = "-";
		sdt->midtexture = "-";
		sd->SetTextureXScale(1.);
		sd->SetTextureYScale(1.);
		sd->Index = index;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Offsetx:
				texOfs[0] = CheckInt(key);
				continue;

			case NAME_Offsety:
				texOfs[1] = CheckInt(key);
				continue;

			case NAME_Texturetop:
				sdt->toptexture = CheckString(key);
				continue;

			case NAME_Texturebottom:
				sdt->bottomtexture = CheckString(key);
				continue;

			case NAME_Texturemiddle:
				sdt->midtexture = CheckString(key);
				continue;

			case NAME_Sector:
				sd->sector = (sector_t*)(intptr_t)CheckInt(key);
				continue;

			default:
				break;
			}

			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
			case NAME_offsetx_top:
				sd->SetTextureXOffset(side_t::top, CheckFloat(key));
				continue;

			case NAME_offsety_top:
				sd->SetTextureYOffset(side_t::top, CheckFloat(key));
				continue;

			case NAME_offsetx_mid:
				sd->SetTextureXOffset(side_t::mid, CheckFloat(key));
				continue;

			case NAME_offsety_mid:
				sd->SetTextureYOffset(side_t::mid, CheckFloat(key));
				continue;

			case NAME_offsetx_bottom:
				sd->SetTextureXOffset(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_offsety_bottom:
				sd->SetTextureYOffset(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_scalex_top:
				sd->SetTextureXScale(side_t::top, CheckFloat(key));
				continue;

			case NAME_scaley_top:
				sd->SetTextureYScale(side_t::top, CheckFloat(key));
				continue;

			case NAME_scalex_mid:
				sd->SetTextureXScale(side_t::mid, CheckFloat(key));
				continue;

			case NAME_scaley_mid:
				sd->SetTextureYScale(side_t::mid, CheckFloat(key));
				continue;

			case NAME_scalex_bottom:
				sd->SetTextureXScale(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_scaley_bottom:
				sd->SetTextureYScale(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_light:
				sd->SetLight(CheckInt(key));
				continue;

			case NAME_lightabsolute:
				Flag(sd->Flags, WALLF_ABSLIGHTING, key);
				continue;

			case NAME_lightfog:
				Flag(sd->Flags, WALLF_LIGHT_FOG, key);
				continue;

			case NAME_nofakecontrast:
				Flag(sd->Flags, WALLF_NOFAKECONTRAST, key);
				continue;

			case NAME_smoothlighting:
				Flag(sd->Flags, WALLF_SMOOTHLIGHTING, key);
				continue;

			case NAME_Wrapmidtex:
				Flag(sd->Flags, WALLF_WRAP_MIDTEX, key);
				continue;

			case NAME_Clipmidtex:
				Flag(sd->Flags, WALLF_CLIP_MIDTEX, key);
				continue;

			case NAME_Nodecals:
				Flag(sd->Flags, WALLF_NOAUTODECALS, key);
				continue;

			default:
				break;

			}
			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Side, index);
			}
		}
		// initialization of these is delayed to allow separate offsets and add them with the global ones.
		sd->AddTextureXOffset(side_t::top, texOfs[0]);
		sd->AddTextureXOffset(side_t::mid, texOfs[0]);
		sd->AddTextureXOffset(side_t::bottom, texOfs[0]);
		sd->AddTextureYOffset(side_t::top, texOfs[1]);
		sd->AddTextureYOffset(side_t::mid, texOfs[1]);
		sd->AddTextureYOffset(side_t::bottom, texOfs[1]);
	}